

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_4_3_cc401a1e_for_u *paVar7;
  ulong uVar8;
  byte bVar9;
  float fVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  uint8_t *puVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ZopfliNode *in_stack_ffffffffffffff00;
  ulong local_f8;
  ushort local_ec;
  
  uVar1 = pos + block_start;
  sVar12 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar12 = uVar1;
  }
  uVar5 = num_bytes - pos;
  iVar3 = params->quality;
  uVar13 = 0x96;
  if (10 < iVar3) {
    uVar13 = 0x145;
  }
  EvaluateNode(block_start,pos,max_backward_limit,(size_t)starting_dist_cache,(int *)model,
               (ZopfliCostModel *)queue,(StartPosQueue *)nodes,in_stack_ffffffffffffff00);
  uVar6 = 2;
  if (pos + 2 <= num_bytes) {
    uVar6 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar37 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar6 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar6 + 0x14) + model->min_cost_cmd_;
    paVar7 = &nodes[pos + 2].u;
    lVar19 = 4;
    uVar23 = 10;
    uVar8 = 2;
    do {
      uVar6 = uVar8;
      if (fVar37 < paVar7->cost) break;
      uVar6 = uVar8 + 1;
      bVar35 = uVar6 == uVar23;
      fVar10 = fVar37 + 1.0;
      if (!bVar35) {
        fVar10 = fVar37;
      }
      fVar37 = fVar10;
      lVar14 = 0;
      if (bVar35) {
        lVar14 = lVar19;
      }
      lVar19 = lVar19 << bVar35;
      uVar23 = uVar23 + lVar14;
      paVar7 = paVar7 + 4;
      lVar14 = pos + uVar8;
      uVar8 = uVar6;
    } while (lVar14 + 1U <= num_bytes);
  }
  puVar15 = ringbuffer + (uVar1 & ringbuffer_mask);
  uVar23 = (ulong)((uint)uVar5 & 7);
  local_f8 = 0;
  uVar8 = 0;
  do {
    uVar16 = queue->idx_;
    uVar31 = 8;
    if (uVar16 < 8) {
      uVar31 = uVar16;
    }
    if (uVar31 <= uVar8) {
      return local_f8;
    }
    uVar31 = (ulong)(((int)uVar8 - (int)uVar16 & 7U) << 5);
    uVar16 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar31 - 8));
    fVar10 = (float)uVar16;
    fVar37 = fVar10;
    if (5 < uVar16) {
      if (uVar16 < 0x82) {
        uVar22 = 0x1f;
        uVar11 = (uint)(uVar16 - 2);
        if (uVar11 != 0) {
          for (; uVar11 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        fVar37 = (float)((int)(uVar16 - 2 >> ((char)(uVar22 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar22 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar16 < 0x842) {
        uVar22 = 0x1f;
        if ((int)fVar10 - 0x42U != 0) {
          for (; (int)fVar10 - 0x42U >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        fVar37 = (float)((uVar22 ^ 0xffe0) + 0x2a);
      }
      else {
        fVar37 = 2.94273e-44;
        if (0x1841 < uVar16) {
          fVar37 = (float)(uint)(ushort)(0x17 - (uVar16 < 0x5842));
        }
      }
    }
    uVar22 = (uint)fVar37 & 0xffff;
    fVar36 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar22] +
             *(float *)((long)queue->q_[0].distance_cache + uVar31 + 0x10);
    if (uVar6 - 1 < uVar5) {
      uVar24 = 0;
      uVar16 = uVar6 - 1;
      do {
        uVar32 = uVar16 + (uVar1 & ringbuffer_mask);
        if (uVar32 <= ringbuffer_mask) {
          uVar34 = (long)kDistanceCacheOffset[uVar24] +
                   (long)*(int *)((long)queue->q_[0].distance_cache +
                                 (ulong)kDistanceCacheIndex[uVar24] * 4 + uVar31);
          if (uVar1 - uVar34 < uVar1 && uVar34 <= sVar12) {
            uVar17 = uVar1 - uVar34 & ringbuffer_mask;
            if ((uVar17 + uVar16 <= ringbuffer_mask) &&
               (ringbuffer[uVar32] == ringbuffer[uVar17 + uVar16])) {
              if (7 < uVar5) {
                lVar19 = 0;
                uVar25 = 0;
LAB_0010c3a7:
                if (*(ulong *)(puVar15 + uVar25 * 8) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar17)
                   ) goto code_r0x0010c3b9;
                uVar25 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar17) ^
                         *(ulong *)(puVar15 + uVar25 * 8);
                uVar17 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar25 = (uVar17 >> 3 & 0x1fffffff) - lVar19;
                goto LAB_0010c3ed;
              }
              puVar20 = puVar15;
              uVar33 = 0;
LAB_0010c59a:
              uVar25 = uVar33;
              if (uVar23 != 0) {
                uVar26 = uVar23 | uVar33;
                uVar28 = uVar23;
                do {
                  uVar25 = uVar33;
                  if (ringbuffer[uVar33 + uVar17] != *puVar20) break;
                  puVar20 = puVar20 + 1;
                  uVar33 = uVar33 + 1;
                  uVar28 = uVar28 - 1;
                  uVar25 = uVar26;
                } while (uVar28 != 0);
              }
LAB_0010c3ed:
              if (uVar16 + 1 <= uVar25) {
                fVar2 = model->cost_dist_[uVar24];
                local_ec = SUB42(fVar37,0);
                paVar7 = &nodes[pos + uVar16 + 1].u;
                uVar17 = uVar16;
                do {
                  uVar16 = uVar17 + 1;
                  iVar21 = (int)uVar17;
                  if (uVar16 < 10) {
                    uVar11 = iVar21 - 1;
                  }
                  else if (uVar16 < 0x86) {
                    uVar11 = 0x1f;
                    uVar29 = (uint)(uVar17 - 5);
                    if (uVar29 != 0) {
                      for (; uVar29 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                      }
                    }
                    uVar11 = (int)(uVar17 - 5 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar11 ^ 0xffffffe0) * 2 + 0x42;
                  }
                  else {
                    uVar11 = 0x17;
                    if (uVar16 < 0x846) {
                      uVar11 = 0x1f;
                      if (iVar21 - 0x45U != 0) {
                        for (; iVar21 - 0x45U >> uVar11 == 0; uVar11 = uVar11 - 1) {
                        }
                      }
                      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
                    }
                  }
                  uVar29 = uVar11 & 7 | uVar22 * 8 & 0x38;
                  if ((ushort)uVar11 < 0x10 && (uVar24 == 0 && local_ec < 8)) {
                    if (7 < (ushort)uVar11) {
                      uVar29 = uVar29 + 0x40;
                    }
                  }
                  else {
                    iVar27 = ((uVar11 & 0xffff) >> 3) + (uVar22 >> 3) * 3;
                    uVar29 = uVar29 + (0x520d40U >> ((char)iVar27 * '\x02' & 0x1fU) & 0xc0) +
                                      iVar27 * 0x40 + 0x40;
                  }
                  fVar38 = fVar36;
                  if (0x7f < (uint)((ulong)uVar29 & 0xffff)) {
                    fVar38 = fVar2 + fVar36;
                  }
                  fVar38 = (float)kCopyExtra[uVar11 & 0xffff] + fVar38 +
                           model->cost_cmd_[(ulong)uVar29 & 0xffff];
                  if (fVar38 < paVar7->cost) {
                    ((ZopfliNode *)(paVar7 + -3))->length = iVar21 + 1U | 0x12000000;
                    paVar7[-2].next = (uint32_t)(float)uVar34;
                    paVar7[-1].next = (uint)fVar10 | (int)uVar24 * 0x8000000 + 0x8000000U;
                    paVar7->cost = fVar38;
                    if (local_f8 <= uVar16) {
                      local_f8 = uVar16;
                    }
                  }
                  uVar33 = uVar17 + 2;
                  paVar7 = paVar7 + 4;
                  uVar17 = uVar16;
                } while (uVar33 <= uVar25);
              }
            }
          }
        }
      } while (((uVar32 <= ringbuffer_mask) && (uVar24 < 0xf)) &&
              (uVar24 = uVar24 + 1, uVar16 < uVar5));
    }
    if (uVar8 < 2 && num_matches != 0) {
      sVar18 = 0;
      uVar16 = uVar6;
      do {
        BVar4 = matches[sVar18];
        uVar34 = (ulong)BVar4 & 0xffffffff;
        uVar31 = uVar34 + 0xf;
        uVar32 = (ulong)(params->dist).num_direct_distance_codes;
        uVar24 = uVar32 + 0x10;
        if (uVar24 <= uVar31) {
          uVar11 = (params->dist).distance_postfix_bits;
          bVar9 = (byte)uVar11;
          uVar31 = ~uVar32 + uVar34 + (4L << (bVar9 & 0x3f));
          uVar29 = 0x1f;
          uVar30 = (uint)uVar31;
          if (uVar30 != 0) {
            for (; uVar30 >> uVar29 == 0; uVar29 = uVar29 - 1) {
            }
          }
          uVar32 = (ulong)((uVar29 ^ 0xffffffe0) + 0x1f);
          lVar19 = uVar32 - uVar11;
          uVar31 = (~(-1 << (bVar9 & 0x1f)) & uVar30) + uVar24 +
                   ((ulong)((uVar31 >> (uVar32 & 0x3f) & 1) != 0) + lVar19 * 2 + -2 <<
                   (bVar9 & 0x3f)) | lVar19 * 0x400;
        }
        uVar32 = (ulong)BVar4 >> 0x25;
        uVar24 = uVar16;
        if (uVar13 < uVar32) {
          uVar24 = uVar32;
        }
        if (sVar12 < uVar34) {
          uVar24 = uVar32;
        }
        if (uVar32 <= uVar16) {
          uVar24 = uVar16;
        }
        uVar16 = uVar24;
        if (uVar16 <= uVar32) {
          fVar2 = model->cost_dist_[(uint)uVar31 & 0x3ff];
          uVar24 = (ulong)(BVar4.length_and_code & 0x1f);
          if (((ulong)BVar4 & 0x1f00000000) == 0) {
            uVar24 = uVar32;
          }
          paVar7 = &nodes[pos + uVar16].u;
          lVar19 = uVar16 * 0x2000000 + 0x12000000;
          do {
            uVar17 = uVar16;
            if (sVar12 < uVar34) {
              uVar17 = uVar24;
            }
            iVar21 = (int)uVar17;
            if (uVar17 < 10) {
              uVar11 = iVar21 - 2;
            }
            else if (uVar17 < 0x86) {
              uVar11 = 0x1f;
              uVar29 = (uint)(uVar17 - 6);
              if (uVar29 != 0) {
                for (; uVar29 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = (int)(uVar17 - 6 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar11 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar11 = 0x17;
              if (uVar17 < 0x846) {
                uVar11 = 0x1f;
                if (iVar21 - 0x46U != 0) {
                  for (; iVar21 - 0x46U >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
              }
            }
            iVar27 = ((uVar11 & 0xffff) >> 3) + (uVar22 >> 3) * 3;
            fVar38 = (float)kCopyExtra[uVar11 & 0xffff] +
                     (float)((uint)(uVar31 >> 10) & 0x3f) + fVar36 + fVar2 +
                     model->cost_cmd_
                     [(uVar11 & 7 | ((uint)fVar37 & 7) << 3) +
                      (0x520d40U >> ((char)iVar27 * '\x02' & 0x1fU) & 0xc0) + iVar27 * 0x40 + 0x40 &
                      0xffff];
            if (fVar38 < paVar7->cost) {
              ((ZopfliNode *)(paVar7 + -3))->length =
                   (uint)uVar16 | (int)lVar19 + iVar21 * -0x2000000;
              paVar7[-2].next = BVar4.distance;
              paVar7[-1].next = (uint32_t)fVar10;
              paVar7->cost = fVar38;
              if (local_f8 <= uVar16) {
                local_f8 = uVar16;
              }
            }
            uVar16 = uVar16 + 1;
            paVar7 = paVar7 + 4;
            lVar19 = lVar19 + 0x2000000;
          } while (uVar32 + 1 != uVar16);
        }
        sVar18 = sVar18 + 1;
      } while (sVar18 != num_matches);
    }
    if (iVar3 < 0xb) {
      return local_f8;
    }
    bVar35 = 3 < uVar8;
    uVar8 = uVar8 + 1;
    if (bVar35) {
      return local_f8;
    }
  } while( true );
code_r0x0010c3b9:
  uVar25 = uVar25 + 1;
  lVar19 = lVar19 + -8;
  puVar20 = puVar15 + (uVar5 & 0xfffffffffffffff8);
  uVar33 = uVar5 & 0xfffffffffffffff8;
  if (uVar5 >> 3 == uVar25) goto LAB_0010c59a;
  goto LAB_0010c3a7;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start, pos, max_backward_limit, gap, starting_dist_cache,
      model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > max_distance + gap)) {
        continue;
      }
      if (backward <= max_distance) {
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > max_distance + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}